

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comoment_suite.cpp
# Opt level: O0

void properties_suite::test_shift_invariant(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  double absolute_tolerance;
  double *in_stack_fffffffffffff9e8;
  value_type local_608;
  value_type local_600;
  value_type local_5f8;
  value_type local_5e8;
  value_type local_5e0 [2];
  double y_4;
  double x_4;
  value_type local_5b8;
  value_type local_5b0;
  value_type local_5a8;
  value_type local_598;
  value_type local_590 [2];
  double y_3;
  double x_3;
  value_type local_568;
  value_type local_560;
  value_type local_558;
  value_type local_548;
  value_type local_540 [2];
  double y_2;
  double x_2;
  value_type local_518;
  value_type local_510;
  value_type local_508;
  value_type local_4f8;
  value_type local_4f0 [2];
  double y_1;
  double x_1;
  value_type local_4c8;
  value_type local_4c0;
  value_type local_4b8;
  value_type local_4a8;
  value_type local_4a0 [2];
  double y;
  double x;
  double b;
  double a;
  covariance<double,_32> rhs;
  covariance<double,_32> lhs;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&lhs.sum.xy,1e-06,absolute_tolerance);
  trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::basic_comoment
            ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&rhs.sum.xy);
  trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::basic_comoment
            ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&a);
  b = 0.5;
  x = 2.0;
  y = 0.0;
  local_4a0[1] = 0.0;
  trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&rhs.sum.xy,0.5,2.0);
  trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&a,0.0,0.0);
  local_4a0[0] = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::
                 unbiased_variance((basic_comoment<double,_32UL,_(trial::online::with)2> *)
                                   &rhs.sum.xy);
  local_4a8 = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::
              unbiased_variance((basic_comoment<double,_32UL,_(trial::online::with)2> *)&a);
  local_4b8 = lhs.sum.xy;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative = lhs.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"lhs.unbiased_variance()","rhs.unbiased_variance()","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0xc1,0x10b3d8,(char *)local_4a0,&local_4a8,in_stack_fffffffffffff9e8,
             predicate_08);
  local_4c0 = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&rhs.sum.xy);
  local_4c8 = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&a);
  x_1 = lhs.sum.xy;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = lhs.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"lhs.variance()","rhs.variance()","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0xc2,0x10b3d8,(char *)&local_4c0,&local_4c8,in_stack_fffffffffffff9e8,
             predicate_07);
  y_1 = -1.0;
  local_4f0[1] = 1.0;
  trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&rhs.sum.xy,-0.5,3.0);
  trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&a,-1.0,1.0);
  local_4f0[0] = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::
                 unbiased_variance((basic_comoment<double,_32UL,_(trial::online::with)2> *)
                                   &rhs.sum.xy);
  local_4f8 = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::
              unbiased_variance((basic_comoment<double,_32UL,_(trial::online::with)2> *)&a);
  local_508 = lhs.sum.xy;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = lhs.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"lhs.unbiased_variance()","rhs.unbiased_variance()","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0xc9,0x10b3d8,(char *)local_4f0,&local_4f8,in_stack_fffffffffffff9e8,
             predicate_06);
  local_510 = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&rhs.sum.xy);
  local_518 = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&a);
  x_2 = lhs.sum.xy;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = lhs.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"lhs.variance()","rhs.variance()","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0xca,0x10b3d8,(char *)&local_510,&local_518,in_stack_fffffffffffff9e8,
             predicate_05);
  y_2 = -2.0;
  local_540[1] = 10.0;
  trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&rhs.sum.xy,-1.5,12.0);
  trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&a,-2.0,10.0);
  local_540[0] = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::
                 unbiased_variance((basic_comoment<double,_32UL,_(trial::online::with)2> *)
                                   &rhs.sum.xy);
  local_548 = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::
              unbiased_variance((basic_comoment<double,_32UL,_(trial::online::with)2> *)&a);
  local_558 = lhs.sum.xy;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = lhs.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"lhs.unbiased_variance()","rhs.unbiased_variance()","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0xd1,0x10b3d8,(char *)local_540,&local_548,in_stack_fffffffffffff9e8,
             predicate_04);
  local_560 = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&rhs.sum.xy);
  local_568 = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&a);
  x_3 = lhs.sum.xy;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = lhs.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"lhs.variance()","rhs.variance()","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0xd2,0x10b3d8,(char *)&local_560,&local_568,in_stack_fffffffffffff9e8,
             predicate_03);
  y_3 = -3.0;
  local_590[1] = 100.0;
  trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&rhs.sum.xy,-2.5,102.0);
  trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&a,-3.0,100.0);
  local_590[0] = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::
                 unbiased_variance((basic_comoment<double,_32UL,_(trial::online::with)2> *)
                                   &rhs.sum.xy);
  local_598 = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::
              unbiased_variance((basic_comoment<double,_32UL,_(trial::online::with)2> *)&a);
  local_5a8 = lhs.sum.xy;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = lhs.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"lhs.unbiased_variance()","rhs.unbiased_variance()","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0xd9,0x10b3d8,(char *)local_590,&local_598,in_stack_fffffffffffff9e8,
             predicate_02);
  local_5b0 = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&rhs.sum.xy);
  local_5b8 = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&a);
  x_4 = lhs.sum.xy;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = lhs.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"lhs.variance()","rhs.variance()","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0xda,0x10b3d8,(char *)&local_5b0,&local_5b8,in_stack_fffffffffffff9e8,
             predicate_01);
  y_4 = -4.0;
  local_5e0[1] = 1000.0;
  trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&rhs.sum.xy,-3.5,1002.0);
  trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&a,-4.0,1000.0);
  local_5e0[0] = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::
                 unbiased_variance((basic_comoment<double,_32UL,_(trial::online::with)2> *)
                                   &rhs.sum.xy);
  local_5e8 = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::
              unbiased_variance((basic_comoment<double,_32UL,_(trial::online::with)2> *)&a);
  local_5f8 = lhs.sum.xy;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = lhs.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"lhs.unbiased_variance()","rhs.unbiased_variance()","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0xe1,0x10b3d8,(char *)local_5e0,&local_5e8,in_stack_fffffffffffff9e8,
             predicate_00);
  local_600 = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&rhs.sum.xy);
  local_608 = trial::online::window::basic_comoment<double,_32UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_32UL,_(trial::online::with)2> *)&a);
  predicate.absolute = tolerance.relative;
  predicate.relative = lhs.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"lhs.variance()","rhs.variance()","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0xe2,0x10b3d8,(char *)&local_600,&local_608,(double *)lhs.sum.xy,predicate);
  return;
}

Assistant:

void test_shift_invariant()
{
    // Cov(X + a, Y + b) = Cov(X, Y)
    const auto tolerance = detail::close_to<double>(1e-6);
    window::covariance<double, 32> lhs;
    window::covariance<double, 32> rhs;
    const double a = 0.5;
    const double b = 2.0;
    {
        const double x = 0.0;
        const double y = 0.0;
        lhs.push(x + a, y + b);
        rhs.push(x, y);
        TRIAL_TEST_WITH(lhs.unbiased_variance(), rhs.unbiased_variance(), tolerance);
        TRIAL_TEST_WITH(lhs.variance(), rhs.variance(), tolerance);
    }
    {
        const double x = -1.0;
        const double y = 1.0;
        lhs.push(x + a, y + b);
        rhs.push(x, y);
        TRIAL_TEST_WITH(lhs.unbiased_variance(), rhs.unbiased_variance(), tolerance);
        TRIAL_TEST_WITH(lhs.variance(), rhs.variance(), tolerance);
    }
    {
        const double x = -2.0;
        const double y = 10.0;
        lhs.push(x + a, y + b);
        rhs.push(x, y);
        TRIAL_TEST_WITH(lhs.unbiased_variance(), rhs.unbiased_variance(), tolerance);
        TRIAL_TEST_WITH(lhs.variance(), rhs.variance(), tolerance);
    }
    {
        const double x = -3.0;
        const double y = 100.0;
        lhs.push(x + a, y + b);
        rhs.push(x, y);
        TRIAL_TEST_WITH(lhs.unbiased_variance(), rhs.unbiased_variance(), tolerance);
        TRIAL_TEST_WITH(lhs.variance(), rhs.variance(), tolerance);
    }
    {
        const double x = -4.0;
        const double y = 1000.0;
        lhs.push(x + a, y + b);
        rhs.push(x, y);
        TRIAL_TEST_WITH(lhs.unbiased_variance(), rhs.unbiased_variance(), tolerance);
        TRIAL_TEST_WITH(lhs.variance(), rhs.variance(), tolerance);
    }
}